

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O3

service * std::experimental::net::v1::detail::service_registry::
          create<std::experimental::net::v1::detail::scheduler,std::experimental::net::v1::execution_context>
                    (void *owner)

{
  service *psVar1;
  
  psVar1 = (service *)operator_new(0xf0);
  (psVar1->key_).type_info_ = (type_info *)0x0;
  (psVar1->key_).id_ = (id *)0x0;
  psVar1->owner_ = (execution_context *)owner;
  psVar1->next_ = (service *)0x0;
  psVar1->_vptr_service = (_func_int **)&PTR__scheduler_00198798;
  *(undefined1 *)&psVar1[1]._vptr_service = 0;
  webfront::http::std::experimental::net::v1::detail::conditionally_enabled_mutex::
  conditionally_enabled_mutex((conditionally_enabled_mutex *)&psVar1[1].key_,true);
  webfront::http::std::experimental::net::v1::detail::posix_event::posix_event
            ((posix_event *)&psVar1[2].next_);
  *(undefined8 *)((long)&psVar1[4].key_.id_ + 4) = 0;
  *(undefined8 *)((long)&psVar1[4].owner_ + 4) = 0;
  psVar1[4].key_.type_info_ = (type_info *)0x0;
  psVar1[4].key_.id_ = (id *)0x0;
  *(undefined1 *)&psVar1[5]._vptr_service = 1;
  psVar1[5].key_.type_info_ = (type_info *)0x0;
  psVar1[5].key_.id_ = (id *)0x0;
  *(undefined8 *)((long)&psVar1[5].key_.id_ + 2) = 0;
  *(undefined8 *)((long)&psVar1[5].owner_ + 2) = 0;
  *(undefined4 *)((long)&psVar1[5].next_ + 4) = 0;
  return psVar1;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}